

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O1

void __thiscall
Http2::FrameWriter::start(FrameWriter *this,FrameType type,FrameFlags flags,quint32 streamID)

{
  pointer puVar1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,9);
  puVar1 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish == puVar1) {
    start();
LAB_001e2e1a:
    start();
LAB_001e2e1f:
    start();
LAB_001e2e24:
    start();
  }
  else {
    *puVar1 = '\0';
    puVar1 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->frame).buffer.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) < 2) goto LAB_001e2e1a;
    puVar1[1] = '\0';
    puVar1 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->frame).buffer.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) < 3) goto LAB_001e2e1f;
    puVar1[2] = '\0';
    puVar1 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->frame).buffer.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) < 4) goto LAB_001e2e24;
    puVar1[3] = type;
    puVar1 = (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (4 < (ulong)((long)(this->frame).buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar1)) {
      puVar1[4] = (uchar)flags.super_QFlagsStorageHelper<Http2::FrameFlag,_4>.
                         super_QFlagsStorage<Http2::FrameFlag>.i;
      puVar1 = (this->frame).buffer.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (5 < (ulong)((long)(this->frame).buffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
        *(quint32 *)(puVar1 + 5) =
             streamID >> 0x18 | (streamID & 0xff0000) >> 8 | (streamID & 0xff00) << 8 |
             streamID << 0x18;
        return;
      }
      goto LAB_001e2e2e;
    }
  }
  start();
LAB_001e2e2e:
  start();
}

Assistant:

void FrameWriter::start(FrameType type, FrameFlags flags, quint32 streamID)
{
    auto &buffer = frame.buffer;

    buffer.resize(frameHeaderSize);
    // The first three bytes - payload size, which is 0 for now.
    buffer[0] = 0;
    buffer[1] = 0;
    buffer[2] = 0;

    buffer[3] = uchar(type);
    buffer[4] = uchar(flags);

    qToBigEndian(streamID, &buffer[5]);
}